

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

ostream * __thiscall wasm::anon_unknown_0::TypePrinter::print(TypePrinter *this,HeapType type)

{
  bool bVar1;
  BasicHeapType BVar2;
  HeapTypeKind HVar3;
  ostream *poVar4;
  HeapType *pHVar5;
  Struct *struct_;
  optional<wasm::HeapType> oVar6;
  _Storage<wasm::HeapType,_true> local_120;
  undefined1 local_118;
  _Storage<wasm::HeapType,_true> local_110;
  undefined1 local_108;
  HeapType local_100;
  Array local_f8;
  Signature local_e8;
  uintptr_t local_d8;
  _Storage<wasm::HeapType,_true> local_d0;
  optional<wasm::HeapType> desc_1;
  _Storage<wasm::HeapType,_true> local_b8;
  optional<wasm::HeapType> desc;
  _Storage<wasm::HeapType,_true> local_a0;
  optional<wasm::HeapType> super;
  bool useSub;
  undefined1 local_68 [8];
  TypeNames names;
  TypePrinter *this_local;
  HeapType type_local;
  
  names.fieldNames._M_h._M_single_bucket = (__node_base_ptr)this;
  this_local = (TypePrinter *)type.id;
  bVar1 = HeapType::isBasic((HeapType *)&this_local);
  if (bVar1) {
    bVar1 = HeapType::isShared((HeapType *)&this_local);
    if (bVar1) {
      std::operator<<(this->os,"(shared ");
    }
    BVar2 = HeapType::getBasic((HeapType *)&this_local,Unshared);
    switch(BVar2) {
    case ext:
      std::operator<<(this->os,"extern");
      break;
    case func:
      std::operator<<(this->os,"func");
      break;
    case cont:
      std::operator<<(this->os,"cont");
      break;
    case any:
      std::operator<<(this->os,"any");
      break;
    case eq:
      std::operator<<(this->os,"eq");
      break;
    case i31:
      std::operator<<(this->os,"i31");
      break;
    case struct_:
      std::operator<<(this->os,"struct");
      break;
    case array:
      std::operator<<(this->os,"array");
      break;
    case exn:
      std::operator<<(this->os,"exn");
      break;
    case string:
      std::operator<<(this->os,"string");
      break;
    case none:
      std::operator<<(this->os,"none");
      break;
    case noext:
      std::operator<<(this->os,"noextern");
      break;
    case nofunc:
      std::operator<<(this->os,"nofunc");
      break;
    case nocont:
      std::operator<<(this->os,"nocont");
      break;
    case noexn:
      std::operator<<(this->os,"noexn");
    }
    bVar1 = HeapType::isShared((HeapType *)&this_local);
    if (bVar1) {
      std::operator<<(this->os,')');
    }
    type_local.id = (uintptr_t)this->os;
  }
  else {
    std::function<wasm::TypeNames_(wasm::HeapType)>::operator()
              ((TypeNames *)local_68,&this->generator,(HeapType)this_local);
    std::operator<<(this->os,"(type ");
    poVar4 = wasm::Name::print((Name *)local_68,this->os);
    std::operator<<(poVar4,' ');
    bVar1 = isTemp((HeapType)this_local);
    if (bVar1) {
      std::operator<<(this->os,"(; temp ;) ");
    }
    super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._15_1_ = 0;
    oVar6 = HeapType::getDeclaredSuperType((HeapType *)&this_local);
    local_a0 = oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
    super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
         oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType>._M_engaged;
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_a0._M_value);
    if ((bVar1) || (bVar1 = HeapType::isOpen((HeapType *)&this_local), bVar1)) {
      super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._15_1_ = 1;
      std::operator<<(this->os,"(sub ");
      bVar1 = HeapType::isOpen((HeapType *)&this_local);
      if (!bVar1) {
        std::operator<<(this->os,"final ");
      }
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_a0._M_value);
      if (bVar1) {
        pHVar5 = std::optional<wasm::HeapType>::operator*
                           ((optional<wasm::HeapType> *)&local_a0._M_value);
        desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._8_8_ = pHVar5->id;
        printHeapTypeName(this,(HeapType)
                               desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::HeapType>._8_8_);
        std::operator<<(this->os,' ');
      }
    }
    bVar1 = HeapType::isShared((HeapType *)&this_local);
    if (bVar1) {
      std::operator<<(this->os,"(shared ");
    }
    oVar6 = HeapType::getDescribedType((HeapType *)&this_local);
    local_b8 = oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
    desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
         oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType>._M_engaged;
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_b8._M_value);
    if (bVar1) {
      std::operator<<(this->os,"(describes ");
      pHVar5 = std::optional<wasm::HeapType>::operator*
                         ((optional<wasm::HeapType> *)&local_b8._M_value);
      desc_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = pHVar5->id;
      printHeapTypeName(this,(HeapType)
                             desc_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::HeapType>._8_8_);
      std::operator<<(this->os,' ');
    }
    oVar6 = HeapType::getDescriptorType((HeapType *)&this_local);
    local_d0 = oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
    desc_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
         oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType>._M_engaged;
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_d0._M_value);
    if (bVar1) {
      std::operator<<(this->os,"(descriptor ");
      pHVar5 = std::optional<wasm::HeapType>::operator*
                         ((optional<wasm::HeapType> *)&local_d0._M_value);
      local_d8 = pHVar5->id;
      printHeapTypeName(this,(HeapType)local_d8);
      std::operator<<(this->os,' ');
    }
    HVar3 = HeapType::getKind((HeapType *)&this_local);
    switch(HVar3) {
    case Basic:
      handle_unreachable("unexpected kind",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                         ,0x743);
    case Func:
      local_e8 = HeapType::getSignature((HeapType *)&this_local);
      print(this,&local_e8);
      break;
    case Struct:
      struct_ = HeapType::getStruct((HeapType *)&this_local);
      print(this,struct_,
            (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
             *)&names.name.super_IString.str._M_str);
      break;
    case Array:
      HeapType::getArray((HeapType *)&local_f8);
      print(this,&local_f8);
      break;
    case Cont:
      local_100.id = (uintptr_t)HeapType::getContinuation((HeapType *)&this_local);
      print(this,(Continuation *)&local_100);
    }
    oVar6 = HeapType::getDescriptorType((HeapType *)&this_local);
    local_110 = oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_payload;
    local_108 = oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_engaged;
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_110._M_value);
    if (bVar1) {
      std::operator<<(this->os,')');
    }
    oVar6 = HeapType::getDescribedType((HeapType *)&this_local);
    local_120 = oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_payload;
    local_118 = oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_engaged;
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_120._M_value);
    if (bVar1) {
      std::operator<<(this->os,')');
    }
    bVar1 = HeapType::isShared((HeapType *)&this_local);
    if (bVar1) {
      std::operator<<(this->os,')');
    }
    if ((super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType>._15_1_ & 1) != 0) {
      std::operator<<(this->os,')');
    }
    type_local.id = (uintptr_t)std::operator<<(this->os,')');
    TypeNames::~TypeNames((TypeNames *)local_68);
  }
  return (ostream *)type_local.id;
}

Assistant:

std::ostream& TypePrinter::print(HeapType type) {
  if (type.isBasic()) {
    if (type.isShared()) {
      os << "(shared ";
    }
    switch (type.getBasic(Unshared)) {
      case HeapType::ext:
        os << "extern";
        break;
      case HeapType::func:
        os << "func";
        break;
      case HeapType::cont:
        os << "cont";
        break;
      case HeapType::any:
        os << "any";
        break;
      case HeapType::eq:
        os << "eq";
        break;
      case HeapType::i31:
        os << "i31";
        break;
      case HeapType::struct_:
        os << "struct";
        break;
      case HeapType::array:
        os << "array";
        break;
      case HeapType::exn:
        os << "exn";
        break;
      case HeapType::string:
        os << "string";
        break;
      case HeapType::none:
        os << "none";
        break;
      case HeapType::noext:
        os << "noextern";
        break;
      case HeapType::nofunc:
        os << "nofunc";
        break;
      case HeapType::nocont:
        os << "nocont";
        break;
      case HeapType::noexn:
        os << "noexn";
        break;
    }
    if (type.isShared()) {
      os << ')';
    }
    return os;
  }

  auto names = generator(type);

  os << "(type ";
  names.name.print(os) << ' ';

  if (isTemp(type)) {
    os << "(; temp ;) ";
  }

  bool useSub = false;
  auto super = type.getDeclaredSuperType();
  if (super || type.isOpen()) {
    useSub = true;
    os << "(sub ";
    if (!type.isOpen()) {
      os << "final ";
    }
    if (super) {
      printHeapTypeName(*super);
      os << ' ';
    }
  }
  if (type.isShared()) {
    os << "(shared ";
  }
  if (auto desc = type.getDescribedType()) {
    os << "(describes ";
    printHeapTypeName(*desc);
    os << ' ';
  }
  if (auto desc = type.getDescriptorType()) {
    os << "(descriptor ";
    printHeapTypeName(*desc);
    os << ' ';
  }
  switch (type.getKind()) {
    case HeapTypeKind::Func:
      print(type.getSignature());
      break;
    case HeapTypeKind::Struct:
      print(type.getStruct(), names.fieldNames);
      break;
    case HeapTypeKind::Array:
      print(type.getArray());
      break;
    case HeapTypeKind::Cont:
      print(type.getContinuation());
      break;
    case HeapTypeKind::Basic:
      WASM_UNREACHABLE("unexpected kind");
  }
  if (type.getDescriptorType()) {
    os << ')';
  }
  if (type.getDescribedType()) {
    os << ')';
  }
  if (type.isShared()) {
    os << ')';
  }
  if (useSub) {
    os << ')';
  }
  return os << ')';
}